

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void args(char *name)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<(poVar1,"RetroShare crawler");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\t");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1," -f <0 or 1> (first run?) ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"NB: The -f Flag set is Required to Run");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void args(char *name) {
    std::cerr << std::endl << "RetroShare crawler" << std::endl;
    std::cerr << "Usage:" << std::endl;
    std::cerr << "\t" << name << " -f <0 or 1> (first run?) " << std::endl << std::endl;
    std::cerr << "NB: The -f Flag set is Required to Run" << std::endl << std::endl;
}